

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_test.cpp
# Opt level: O2

void __thiscall
Spectrum_SamplingPdfXYZ_Test::~Spectrum_SamplingPdfXYZ_Test(Spectrum_SamplingPdfXYZ_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Spectrum, SamplingPdfXYZ) {
    // Make sure we can integrate the sum of the x+y+z matching curves correctly
    Float impSum = 0, unifSum = 0;
    int n = 10000;
    for (Float u : Stratified1D(n)) {
        {
            // Uniform
            Float lambda = Lerp(u, Lambda_min, Lambda_max);
            Float pdf = 1. / (Lambda_max - Lambda_min);
            unifSum +=
                (Spectra::X()(lambda) + Spectra::Y()(lambda) + Spectra::Z()(lambda)) /
                pdf;
        }

        Float lambda = SampleXYZMatching(u);
        Float pdf = XYZMatchingPDF(lambda);
        if (pdf > 0)
            impSum +=
                (Spectra::X()(lambda) + Spectra::Y()(lambda) + Spectra::Z()(lambda)) /
                pdf;
    }
    Float impInt = impSum / n, unifInt = unifSum / n;

    EXPECT_LT(std::abs((impInt - unifInt) / unifInt), 1e-3)
        << impInt << " vs. " << unifInt;
}